

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mir-gen.c
# Opt level: O0

void solve_dataflow(gen_ctx_t gen_ctx,int forward_p,_func_void_bb_t *con_func_0,
                   _func_int_gen_ctx_t_bb_t *con_func_n,_func_int_gen_ctx_t_bb_t *trans_func)

{
  bb_t_conflict pbVar1;
  VARR_bb_t *pVVar2;
  uint uVar3;
  int iVar4;
  size_t sVar5;
  bb_t_conflict *__base;
  in_edge_t_conflict peVar6;
  out_edge_t peVar7;
  code *__compar;
  out_edge_t local_68;
  edge_t_conflict e;
  int changed_p;
  VARR_bb_t *t;
  bb_t_conflict *addr;
  bb_t_conflict bb;
  size_t iter;
  size_t i;
  _func_int_gen_ctx_t_bb_t *trans_func_local;
  _func_int_gen_ctx_t_bb_t *con_func_n_local;
  _func_void_bb_t *con_func_0_local;
  int forward_p_local;
  gen_ctx_t gen_ctx_local;
  
  VARR_bb_ttrunc(gen_ctx->data_flow_ctx->worklist,0);
  for (addr = (bb_t_conflict *)DLIST_bb_t_head(&gen_ctx->curr_cfg->bbs);
      addr != (bb_t_conflict *)0x0; addr = (bb_t_conflict *)DLIST_bb_t_next((bb_t_conflict)addr)) {
    VARR_bb_tpush(gen_ctx->data_flow_ctx->worklist,(bb_t_conflict)addr);
  }
  VARR_bb_ttrunc(gen_ctx->data_flow_ctx->pending,0);
  bb = (bb_t_conflict)0x0;
  while (sVar5 = VARR_bb_tlength(gen_ctx->data_flow_ctx->worklist), sVar5 != 0) {
    VARR_bb_ttrunc(gen_ctx->data_flow_ctx->pending,0);
    __base = VARR_bb_taddr(gen_ctx->data_flow_ctx->worklist);
    sVar5 = VARR_bb_tlength(gen_ctx->data_flow_ctx->worklist);
    __compar = post_cmp;
    if (forward_p != 0) {
      __compar = rpost_cmp;
    }
    qsort(__base,sVar5,8,__compar);
    bitmap_clear(gen_ctx->data_flow_ctx->bb_to_consider);
    for (iter = 0; sVar5 = VARR_bb_tlength(gen_ctx->data_flow_ctx->worklist), iter < sVar5;
        iter = iter + 1) {
      e._4_4_ = (uint)(bb == (bb_t_conflict)0x0);
      pbVar1 = __base[iter];
      if (forward_p == 0) {
        peVar7 = DLIST_out_edge_t_head(&pbVar1->out_edges);
        if (peVar7 == (out_edge_t)0x0) {
          (*con_func_0)(pbVar1);
        }
        else {
          uVar3 = (*con_func_n)(gen_ctx,pbVar1);
          e._4_4_ = uVar3 | e._4_4_;
        }
      }
      else {
        peVar6 = DLIST_in_edge_t_head(&pbVar1->in_edges);
        if (peVar6 == (in_edge_t_conflict)0x0) {
          (*con_func_0)(pbVar1);
        }
        else {
          uVar3 = (*con_func_n)(gen_ctx,pbVar1);
          e._4_4_ = uVar3 | e._4_4_;
        }
      }
      if ((e._4_4_ != 0) && (iVar4 = (*trans_func)(gen_ctx,pbVar1), iVar4 != 0)) {
        if (forward_p == 0) {
          for (local_68 = DLIST_in_edge_t_head(&pbVar1->in_edges);
              local_68 != (in_edge_t_conflict)0x0; local_68 = DLIST_in_edge_t_next(local_68)) {
            iVar4 = bitmap_set_bit_p(gen_ctx->data_flow_ctx->bb_to_consider,local_68->src->index);
            if (iVar4 != 0) {
              VARR_bb_tpush(gen_ctx->data_flow_ctx->pending,local_68->src);
            }
          }
        }
        else {
          for (local_68 = DLIST_out_edge_t_head(&pbVar1->out_edges); local_68 != (out_edge_t)0x0;
              local_68 = DLIST_out_edge_t_next(local_68)) {
            iVar4 = bitmap_set_bit_p(gen_ctx->data_flow_ctx->bb_to_consider,local_68->dst->index);
            if (iVar4 != 0) {
              VARR_bb_tpush(gen_ctx->data_flow_ctx->pending,local_68->dst);
            }
          }
        }
      }
    }
    bb = (bb_t_conflict)((long)&bb->index + 1);
    pVVar2 = gen_ctx->data_flow_ctx->worklist;
    gen_ctx->data_flow_ctx->worklist = gen_ctx->data_flow_ctx->pending;
    gen_ctx->data_flow_ctx->pending = pVVar2;
  }
  return;
}

Assistant:

static void solve_dataflow (gen_ctx_t gen_ctx, int forward_p, void (*con_func_0) (bb_t),
                            int (*con_func_n) (gen_ctx_t, bb_t),
                            int (*trans_func) (gen_ctx_t, bb_t)) {
  size_t i, iter;
  bb_t bb, *addr;
  VARR (bb_t) * t;

  VARR_TRUNC (bb_t, worklist, 0);
  for (bb = DLIST_HEAD (bb_t, curr_cfg->bbs); bb != NULL; bb = DLIST_NEXT (bb_t, bb))
    VARR_PUSH (bb_t, worklist, bb);
  VARR_TRUNC (bb_t, pending, 0);
  iter = 0;
  while (VARR_LENGTH (bb_t, worklist) != 0) {
    VARR_TRUNC (bb_t, pending, 0);
    addr = VARR_ADDR (bb_t, worklist);
    qsort (addr, VARR_LENGTH (bb_t, worklist), sizeof (bb), forward_p ? rpost_cmp : post_cmp);
    bitmap_clear (bb_to_consider);
    for (i = 0; i < VARR_LENGTH (bb_t, worklist); i++) {
      int changed_p = iter == 0;
      edge_t e;

      bb = addr[i];
      if (forward_p) {
        if (DLIST_HEAD (in_edge_t, bb->in_edges) == NULL)
          con_func_0 (bb);
        else
          changed_p |= con_func_n (gen_ctx, bb);
      } else {
        if (DLIST_HEAD (out_edge_t, bb->out_edges) == NULL)
          con_func_0 (bb);
        else
          changed_p |= con_func_n (gen_ctx, bb);
      }
      if (changed_p && trans_func (gen_ctx, bb)) {
        if (forward_p) {
          for (e = DLIST_HEAD (out_edge_t, bb->out_edges); e != NULL;
               e = DLIST_NEXT (out_edge_t, e))
            if (bitmap_set_bit_p (bb_to_consider, e->dst->index)) VARR_PUSH (bb_t, pending, e->dst);
        } else {
          for (e = DLIST_HEAD (in_edge_t, bb->in_edges); e != NULL; e = DLIST_NEXT (in_edge_t, e))
            if (bitmap_set_bit_p (bb_to_consider, e->src->index)) VARR_PUSH (bb_t, pending, e->src);
        }
      }
    }
    iter++;
    t = worklist;
    worklist = pending;
    pending = t;
  }
}